

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_3::MutableRenderBufferTest::iterate(MutableRenderBufferTest *this)

{
  deUint32 dVar1;
  deBool dVar2;
  deUint32 local_28;
  deUint32 frontBufferPixel;
  deUint32 backBufferPixel;
  int frameNumber;
  Library *egl;
  MutableRenderBufferTest *this_local;
  
  egl = (Library *)this;
  _backBufferPixel = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  for (frontBufferPixel = 1; (int)frontBufferPixel < 5; frontBufferPixel = frontBufferPixel + 1) {
    drawAndSwap(this,_backBufferPixel,frontBufferPixel,false);
  }
  do {
    (*_backBufferPixel->_vptr_Library[0x30])
              (_backBufferPixel,this->m_eglDisplay,this->m_eglSurface,0x3086,0x3085);
    dVar1 = (*_backBufferPixel->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                     ,0xe7);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  drawAndSwap(this,_backBufferPixel,frontBufferPixel,false);
  do {
    frontBufferPixel = frontBufferPixel + 1;
    if (9 < (int)frontBufferPixel) {
      do {
        (*_backBufferPixel->_vptr_Library[0x30])
                  (_backBufferPixel,this->m_eglDisplay,this->m_eglSurface,0x3086,0x3084);
        dVar1 = (*_backBufferPixel->_vptr_Library[0x1f])();
        eglu::checkError(dVar1,
                         "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_BACK_BUFFER)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMutableRenderBufferTests.cpp"
                         ,0xfd);
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      for (; (int)frontBufferPixel < 0xe; frontBufferPixel = frontBufferPixel + 1) {
        drawAndSwap(this,_backBufferPixel,frontBufferPixel,false);
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    local_28 = 0xffffffff;
    dVar1 = drawAndSwap(this,_backBufferPixel,frontBufferPixel,true);
    (*(this->m_gl).readPixels)(0,0,1,1,0x1908,0x1401,&local_28);
  } while (local_28 == dVar1);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Surface isn\'t single-buffered");
  return STOP;
}

Assistant:

TestCase::IterateResult MutableRenderBufferTest::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	int frameNumber = 1;

	// run a few back-buffered frames even if we can't verify their contents
	for (; frameNumber < 5; frameNumber++)
	{
		drawAndSwap(egl, frameNumber, false);
	}

	// switch to single-buffer rendering
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_SINGLE_BUFFER));

	// Use eglSwapBuffers for the first frame
	drawAndSwap(egl, frameNumber, false);
	frameNumber++;

	// test a few single-buffered frames
	for (; frameNumber < 10; frameNumber++)
	{
		deUint32 backBufferPixel = 0xFFFFFFFF;
		deUint32 frontBufferPixel = drawAndSwap(egl, frameNumber, true);
		m_gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &backBufferPixel);

		// when single buffered, front-buffer == back-buffer
		if (backBufferPixel != frontBufferPixel)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Surface isn't single-buffered");
			return STOP;
		}
	}

	// switch back to back-buffer rendering
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_RENDER_BUFFER, EGL_BACK_BUFFER));

	// run a few back-buffered frames even if we can't verify their contents
	for (; frameNumber < 14; frameNumber++)
	{
		drawAndSwap(egl, frameNumber, false);
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}